

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_suite.cpp
# Opt level: O0

void vector_suite::test_int_one(void)

{
  string local_238 [36];
  value_type_conflict3 local_214;
  undefined1 local_210 [8];
  vector<int,_std::allocator<int>_> value;
  undefined1 local_1e8 [8];
  oarchive ar;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::basic_oarchive<char>::basic_oarchive<std::__cxx11::ostringstream>
            ((basic_oarchive<char> *)local_1e8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_210);
  local_214 = 1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_210,&local_214);
  boost::archive::detail::interface_oarchive<trial::protocol::json::basic_oarchive<char>>::
  operator<<((interface_oarchive<trial::protocol::json::basic_oarchive<char>> *)local_1e8,
             (vector<int,_std::allocator<int>_> *)local_210);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[4]>
            ("result.str()","\"[1]\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/oarchive_suite.cpp"
             ,0x1c3,"void vector_suite::test_int_one()",local_238,"[1]");
  std::__cxx11::string::~string(local_238);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_210);
  trial::protocol::json::basic_oarchive<char>::~basic_oarchive((basic_oarchive<char> *)local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_int_one()
{
    std::ostringstream result;
    json::oarchive ar(result);
    std::vector<int> value;
    value.push_back(1);
    ar << value;
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "[1]");
}